

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

Ivy_FraigMan_t * Ivy_FraigStart(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  Ivy_FraigSim_t *pIVar1;
  char *pcVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  Ivy_FraigSim_t **ppIVar7;
  long lVar8;
  Ivy_FraigMan_t *pIVar9;
  Ivy_Man_t *pIVar10;
  char *__s;
  uint *puVar11;
  int *piVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  Ivy_FraigSim_t *pIVar19;
  int iVar20;
  uint uVar21;
  
  lVar8 = (long)pManAig->vObjs->nSize;
  if (0 < lVar8) {
    lVar17 = 0;
    do {
      pvVar4 = pManAig->vObjs->pArray[lVar17];
      if ((pvVar4 != (void *)0x0) &&
         ((*(long *)((long)pvVar4 + 0x48) != 0 || (*(long *)((long)pvVar4 + 0x20) != 0)))) {
        __assert_fail("!pObj->pEquiv && !pObj->pFanout",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                      ,0x233,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
      }
      lVar17 = lVar17 + 1;
    } while (lVar8 != lVar17);
  }
  pIVar9 = (Ivy_FraigMan_t *)calloc(1,0x138);
  pIVar9->pParams = pParams;
  pIVar9->pManAig = pManAig;
  pIVar10 = Ivy_ManStartFrom(pManAig);
  pIVar9->pManFraig = pIVar10;
  iVar3 = pParams->nSimWords;
  pIVar9->nSimWords = iVar3;
  iVar15 = pManAig->nCreated - pManAig->nDeleted;
  iVar20 = iVar3 * 4 + 0x20;
  __s = (char *)malloc((long)(iVar15 * iVar20));
  pIVar9->pSimWords = __s;
  iVar18 = 0;
  memset(__s,0,(long)iVar20);
  lVar8 = (long)pManAig->vObjs->nSize;
  if (0 < lVar8) {
    ppvVar14 = pManAig->vObjs->pArray;
    pIVar19 = (Ivy_FraigSim_t *)0x0;
    lVar17 = 0;
    iVar18 = 0;
    do {
      pvVar4 = ppvVar14[lVar17];
      if (pvVar4 != (void *)0x0) {
        pIVar1 = (Ivy_FraigSim_t *)(__s + iVar18 * iVar20);
        pcVar2 = __s + (long)(iVar18 * iVar20) + 8;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        if ((*(uint *)((long)pvVar4 + 8) & 0xf) - 7 < 0xfffffffe) {
          pIVar1->pFanin0 = (Ivy_FraigSim_t *)0x0;
          pIVar1->pFanin1 = (Ivy_FraigSim_t *)0x0;
          uVar16 = 0;
        }
        else {
          ppIVar7 = (Ivy_FraigSim_t **)(__s + (long)((iVar18 + -1) * iVar20) + 8);
          if (pIVar19 == (Ivy_FraigSim_t *)0x0) {
            pIVar19 = pIVar1;
            ppIVar7 = &pIVar9->pSimStart;
          }
          *ppIVar7 = pIVar1;
          uVar5 = *(ulong *)((long)pvVar4 + 0x10);
          pIVar1->pFanin0 = *(Ivy_FraigSim_t **)((uVar5 & 0xfffffffffffffffe) + 0x20);
          uVar6 = *(ulong *)((long)pvVar4 + 0x18);
          pIVar1->pFanin1 = *(Ivy_FraigSim_t **)((uVar6 & 0xfffffffffffffffe) + 0x20);
          if ((uVar5 & 1) == 0) {
            uVar16 = *(uint *)(uVar5 + 8) >> 7 & 1;
          }
          else {
            uVar16 = (uint)((*(byte *)((uVar5 & 0xfffffffffffffffe) + 8) & 0x80) == 0);
          }
          if ((uVar6 & 1) == 0) {
            uVar21 = *(uint *)(uVar6 + 8) >> 7 & 1;
          }
          else {
            uVar21 = (uint)((*(byte *)((uVar6 & 0xfffffffffffffffe) + 8) & 0x80) == 0);
          }
          uVar16 = *(uint *)((long)pvVar4 + 8) >> 7 & 1 | uVar16 * 4 + uVar21 * 2;
        }
        iVar18 = iVar18 + 1;
        pIVar1->Type = uVar16;
        *(Ivy_FraigSim_t **)((long)pvVar4 + 0x20) = pIVar1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar8 != lVar17);
  }
  if (iVar18 != iVar15) {
    __assert_fail("k == Ivy_ManObjNum(pManAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,599,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
  }
  iVar15 = ((pManAig->nObjs[1] >> 5) + 1) - (uint)((pManAig->nObjs[1] & 0x1fU) == 0);
  pIVar9->nPatWords = iVar15;
  puVar11 = (uint *)malloc((long)iVar15 << 2);
  pIVar9->pPatWords = puVar11;
  piVar12 = (int *)malloc((long)iVar3 << 7);
  pIVar9->pPatScores = piVar12;
  pVVar13 = (Vec_Ptr_t *)malloc(0x10);
  pVVar13->nCap = 100;
  pVVar13->nSize = 0;
  ppvVar14 = (void **)malloc(800);
  pVVar13->pArray = ppvVar14;
  pIVar9->vPiVars = pVVar13;
  srand(0xabcabc);
  return pIVar9;
}

Assistant:

Ivy_FraigMan_t * Ivy_FraigStart( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, k, EntrySize;
    // clean the fanout representation
    Ivy_ManForEachObj( pManAig, pObj, i )
//        pObj->pEquiv = pObj->pFanout = pObj->pNextFan0 = pObj->pNextFan1 = pObj->pPrevFan0 = pObj->pPrevFan1 = NULL;
        assert( !pObj->pEquiv && !pObj->pFanout );
    // allocat the fraiging manager
    p = ABC_ALLOC( Ivy_FraigMan_t, 1 );
    memset( p, 0, sizeof(Ivy_FraigMan_t) );
    p->pParams   = pParams;
    p->pManAig   = pManAig;
    p->pManFraig = Ivy_ManStartFrom( pManAig );
    // allocate simulation info
    p->nSimWords    = pParams->nSimWords;
//    p->pSimWords    = ABC_ALLOC( unsigned, Ivy_ManObjNum(pManAig) * p->nSimWords ); 
    EntrySize    = sizeof(Ivy_FraigSim_t) + sizeof(unsigned) * p->nSimWords;
    p->pSimWords = (char *)ABC_ALLOC( char, Ivy_ManObjNum(pManAig) * EntrySize ); 
    memset( p->pSimWords, 0, (size_t)EntrySize );
    k = 0;
    Ivy_ManForEachObj( pManAig, pObj, i )
    {
        pSims = (Ivy_FraigSim_t *)(p->pSimWords + EntrySize * k++);
        pSims->pNext = NULL;
        if ( Ivy_ObjIsNode(pObj) )
        {
            if ( p->pSimStart == NULL )
                p->pSimStart = pSims;
            else
                ((Ivy_FraigSim_t *)(p->pSimWords + EntrySize * (k-2)))->pNext = pSims;
            pSims->pFanin0 = Ivy_ObjSim( Ivy_ObjFanin0(pObj) );
            pSims->pFanin1 = Ivy_ObjSim( Ivy_ObjFanin1(pObj) );
            pSims->Type = (Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) << 2) | (Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj)) << 1) | pObj->fPhase;
        }
        else
        {
            pSims->pFanin0 = NULL;
            pSims->pFanin1 = NULL;
            pSims->Type = 0;
        }
        Ivy_ObjSetSim( pObj, pSims );
    }
    assert( k == Ivy_ManObjNum(pManAig) );
    // allocate storage for sim pattern
    p->nPatWords  = Ivy_BitWordNum( Ivy_ManPiNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->pPatScores = ABC_ALLOC( int, 32 * p->nSimWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // set random number generator
    srand( 0xABCABC );
    return p;
}